

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

void CVmRun::get_local_from_frame
               (vm_val_t *val,vm_val_t *fp,int varnum,int is_param,int is_ctx_local,int ctx_arr_idx)

{
  vm_val_t *pvVar1;
  vm_datatype_t vVar2;
  undefined4 uVar3;
  vm_obj_id_t vVar4;
  undefined4 uVar5;
  vm_val_t idxval;
  vm_val_t local_10;
  
  if (is_param == 0) {
    pvVar1 = fp + varnum;
    if (is_ctx_local != 0) {
      local_10.typ = VM_INT;
      local_10.val.intval = ctx_arr_idx;
      apply_index(val,pvVar1,&local_10);
      return;
    }
    vVar2 = pvVar1->typ;
    uVar3 = *(undefined4 *)&pvVar1->field_0x4;
    vVar4 = (pvVar1->val).obj;
    uVar5 = *(undefined4 *)((long)&pvVar1->val + 4);
  }
  else {
    pvVar1 = fp + (long)(-0xb - varnum) + -1;
    vVar2 = pvVar1->typ;
    uVar3 = *(undefined4 *)&pvVar1->field_0x4;
    vVar4 = (pvVar1->val).obj;
    uVar5 = *(undefined4 *)((long)&pvVar1->val + 4);
  }
  val->typ = vVar2;
  *(undefined4 *)&val->field_0x4 = uVar3;
  (val->val).obj = vVar4;
  *(undefined4 *)((long)&val->val + 4) = uVar5;
  return;
}

Assistant:

void CVmRun::get_local_from_frame(VMG_ vm_val_t *val, vm_val_t *fp,
                                  int varnum, int is_param,
                                  int is_ctx_local, int ctx_arr_idx)
{
    /* check which kind of variable we have */
    if (is_param)
    {
        /* parameter - get it from the frame */
        *val = *get_param_from_frame(vmg_ fp, varnum);
    }
    else if (is_ctx_local)
    {
        /* context local - get the context local */
        vm_val_t *cl = get_local_from_frame(vmg_ fp, varnum);

        /* index it to get the local */
        vm_val_t idxval;
        idxval.set_int(ctx_arr_idx);
        apply_index(vmg_ val, cl, &idxval);
    }
    else
    {
        /* regular local - get it from the frame */
        *val = *get_local_from_frame(vmg_ fp, varnum);
    }
}